

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

void strappend_base64(xar *xar,archive_string *as,char *s,size_t l)

{
  bool bVar1;
  char **ppcVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t n;
  uint uVar6;
  archive_string *paVar7;
  char *pcVar8;
  uchar buff [256];
  byte local_138 [264];
  
  pbVar3 = local_138;
  sVar5 = 0;
  do {
    n = sVar5;
    if (s == (char *)0x0) break;
    if ((base64[*(byte *)&as->s] < 0) || (base64[*(byte *)((long)&as->s + 1)] < 0)) {
      bVar1 = false;
      pbVar4 = pbVar3;
      paVar7 = as;
      pcVar8 = s;
    }
    else {
      paVar7 = (archive_string *)((long)&as->s + 2);
      uVar6 = base64[*(byte *)((long)&as->s + 1)] << 0xc | base64[*(byte *)&as->s] << 0x12;
      pbVar4 = pbVar3 + 1;
      *pbVar3 = (byte)(uVar6 >> 0x10);
      n = sVar5 + 1;
      pcVar8 = s + -2;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        ppcVar2 = &paVar7->s;
        if (base64[*(byte *)ppcVar2] < 0) {
          bVar1 = false;
          goto LAB_00258acf;
        }
        paVar7 = (archive_string *)((long)&as->s + 3);
        uVar6 = uVar6 | base64[*(byte *)ppcVar2] << 6;
        pbVar3[1] = (byte)(uVar6 >> 8);
        pbVar4 = pbVar3 + 2;
        n = sVar5 + 2;
        pcVar8 = s + -3;
      }
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        ppcVar2 = &paVar7->s;
        if (base64[*(byte *)ppcVar2] < 0) {
          bVar1 = false;
          goto LAB_00258acf;
        }
        paVar7 = (archive_string *)((long)&paVar7->s + 1);
        *pbVar4 = (byte)base64[*(byte *)ppcVar2] | (byte)uVar6;
        pbVar4 = pbVar4 + 1;
        n = n + 1;
        pcVar8 = pcVar8 + -1;
      }
      bVar1 = true;
      if (n - 0xfd < 0xffffffffffffff00) {
        archive_strncat((archive_string *)xar,local_138,n);
        pbVar4 = local_138;
        n = 0;
      }
    }
LAB_00258acf:
    pbVar3 = pbVar4;
    sVar5 = n;
    as = paVar7;
    s = pcVar8;
  } while (bVar1);
  if (n != 0) {
    archive_strncat((archive_string *)xar,local_138,n);
  }
  return;
}

Assistant:

static void
strappend_base64(struct xar *xar,
    struct archive_string *as, const char *s, size_t l)
{
	unsigned char buff[256];
	unsigned char *out;
	const unsigned char *b;
	size_t len;

	(void)xar; /* UNUSED */
	len = 0;
	out = buff;
	b = (const unsigned char *)s;
	while (l > 0) {
		int n = 0;

		if (base64[b[0]] < 0 || base64[b[1]] < 0)
			break;
		n = base64[*b++] << 18;
		n |= base64[*b++] << 12;
		*out++ = n >> 16;
		len++;
		l -= 2;

		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++] << 6;
			*out++ = (n >> 8) & 0xFF;
			len++;
			--l;
		}
		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++];
			*out++ = n & 0xFF;
			len++;
			--l;
		}
		if (len+3 >= sizeof(buff)) {
			archive_strncat(as, (const char *)buff, len);
			len = 0;
			out = buff;
		}
	}
	if (len > 0)
		archive_strncat(as, (const char *)buff, len);
}